

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  AssertionStats *pAVar1;
  
  printSourceInfo(this);
  pAVar1 = this->stats;
  if ((pAVar1->totals).assertions.failed + (pAVar1->totals).assertions.passed +
      (pAVar1->totals).assertions.failedButOk == 0) {
    std::operator<<(this->stream,"\n");
  }
  else {
    if ((((this->result->m_resultData).resultType & FailureBit) == Ok) ||
       (((this->result->m_info).resultDisposition & SuppressFail) != 0)) {
      std::operator<<(this->stream,"\n");
    }
    printResultType(this);
    printOriginalExpression(this);
    printReconstructedExpression(this);
  }
  printMessage(this);
  return;
}

Assistant:

void print() const {
				printSourceInfo();
				if (stats.totals.assertions.total() > 0) {
					if (result.isOk())
						stream << "\n";
					printResultType();
					printOriginalExpression();
					printReconstructedExpression();
				}
				else {
					stream << "\n";
				}
				printMessage();
			}